

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::
FunctionMocker<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>::
UntypedDescribeUninterestingCall
          (FunctionMocker<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
           *this,void *untyped_args,ostream *os)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Uninteresting mock function call - ",0x23);
  DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"    Function call: ",0x13);
  __s = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  PrintTo<solitaire::piles::PileId>((tuple<solitaire::piles::PileId> *)untyped_args,os);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    *os << "Uninteresting mock function call - ";
    DescribeDefaultActionTo(args, os);
    *os << "    Function call: " << Name();
    UniversalPrint(args, os);
  }